

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::SetTemplateToken::SetTemplateToken
          (SetTemplateToken *this,Location *loc,SpaceHandling pre,SpaceHandling post,string *ns,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vns,shared_ptr<minja::Expression> *v)

{
  shared_ptr<minja::Expression> *in_RDI;
  string *in_R8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000008;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000010;
  Location *in_stack_ffffffffffffffc0;
  string *this_00;
  Type in_stack_ffffffffffffffcc;
  TemplateToken *in_stack_ffffffffffffffd0;
  
  TemplateToken::TemplateToken
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
             (SpaceHandling)((ulong)in_RDI >> 0x20),(SpaceHandling)in_RDI);
  (in_RDI->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__SetTemplateToken_0041d180;
  this_00 = (string *)(in_RDI + 3);
  std::__cxx11::string::string(this_00,in_R8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_00000010,in_stack_00000008);
  std::shared_ptr<minja::Expression>::shared_ptr((shared_ptr<minja::Expression> *)this_00,in_RDI);
  return;
}

Assistant:

SetTemplateToken(const Location & loc, SpaceHandling pre, SpaceHandling post, const std::string & ns, const std::vector<std::string> & vns, std::shared_ptr<Expression> && v)
      : TemplateToken(Type::Set, loc, pre, post), ns(ns), var_names(vns), value(std::move(v)) {}